

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pointer __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
::iterator::operator->(iterator *this)

{
  code *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  Span<const_int> options_path;
  string_view option_name;
  reference ppVar4;
  OptionsType *pOVar5;
  pointer_____offset_0x10___ *ppuVar6;
  pointer extraout_RAX;
  int in_ECX;
  int iVar7;
  Descriptor *this_00;
  Proto *in_RSI;
  size_t in_R8;
  char *in_R9;
  string_view name_scope;
  string_view element_name;
  FlatAllocator *unaff_retaddr;
  int iStack_74;
  vector<int,_std::allocator<int>_> avStack_70 [2];
  pointer piStack_40;
  size_type sStack_38;
  
  pcVar1 = (code *)this->ctrl_;
  if (pcVar1 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
    ::iterator::operator->((iterator *)this);
  }
  else {
    iVar7 = 0x4e07b0;
    in_ECX = 0x4e07b0;
    if (pcVar1 != absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
      if (-1 < (char)*pcVar1) {
        ppVar4 = operator*(this);
        return ppVar4;
      }
      goto LAB_0020a668;
    }
  }
  iVar7 = in_ECX;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
  ::iterator::operator->((iterator *)this);
LAB_0020a668:
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
  ::iterator::operator->((iterator *)this);
  avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (int *)0x0;
  avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  iStack_74 = iVar7;
  google::protobuf::Descriptor::GetLocationPath(this_00,avStack_70);
  if (avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)avStack_70,
               (iterator)
               avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,&iStack_74);
  }
  else {
    *avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = iStack_74;
    avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  pcVar2 = this_00->all_names_[1]._M_dataplus._M_p;
  sVar3 = this_00->all_names_[1]._M_string_length;
  sStack_38 = (long)avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
  piStack_40 = avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
  options_path.len_ = sStack_38;
  options_path.ptr_ =
       avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  option_name._M_str = in_R9;
  option_name._M_len = in_R8;
  name_scope._M_str = pcVar2;
  name_scope._M_len = sVar3;
  element_name._M_str = pcVar2;
  element_name._M_len = sVar3;
  pOVar5 = google::protobuf::DescriptorBuilder::AllocateOptionsImpl<google::protobuf::Descriptor>
                     ((DescriptorBuilder *)this,name_scope,element_name,in_RSI,options_path,
                      option_name,unaff_retaddr);
  this_00->options_ = pOVar5;
  ppuVar6 = &google::protobuf::_FeatureSet_default_instance_;
  this_00->proto_features_ = (FeatureSet *)&google::protobuf::_FeatureSet_default_instance_;
  this_00->merged_features_ = (FeatureSet *)&google::protobuf::_FeatureSet_default_instance_;
  if (avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)avStack_70[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    ppuVar6 = (pointer_____offset_0x10___ *)extraout_RAX;
  }
  return (pointer)ppuVar6;
}

Assistant:

pointer operator->() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator->");
      return &operator*();
    }